

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O3

void google::protobuf::TestUtil::AddRepeatedFields2<proto2_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  bool bVar1;
  void *pvVar2;
  FieldDescriptor *pFVar3;
  Metadata MVar4;
  Metadata MVar5;
  string_view name;
  string_view name_00;
  string local_68;
  string local_48;
  
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_int32_,0x12d);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_int64_,0x12e);
  RepeatedField<unsigned_int>::Add(&(message->field_0)._impl_.repeated_uint32_,0x12f);
  RepeatedField<unsigned_long>::Add(&(message->field_0)._impl_.repeated_uint64_,0x130);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_sint32_,0x131);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_sint64_,0x132);
  RepeatedField<unsigned_int>::Add(&(message->field_0)._impl_.repeated_fixed32_,0x133);
  RepeatedField<unsigned_long>::Add(&(message->field_0)._impl_.repeated_fixed64_,0x134);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_sfixed32_,0x135);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_sfixed64_,0x136);
  RepeatedField<float>::Add(&(message->field_0)._impl_.repeated_float_,311.0);
  RepeatedField<double>::Add(&(message->field_0)._impl_.repeated_double_,312.0);
  RepeatedField<bool>::Add(&(message->field_0)._impl_.repeated_bool_,false);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[4]>
            (&(message->field_0)._impl_.repeated_string_,(char (*) [4])"315");
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[4],google::protobuf::internal::BytesTag>
            ((undefined1 *)((long)&message->field_0 + 0xf8),"316");
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(message->field_0)._impl_.repeatedgroup_.super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypes_RepeatedGroup>);
  *(undefined4 *)((long)pvVar2 + 0x18) = 0x13d;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(message->field_0)._impl_.repeated_nested_message_.super_RepeatedPtrFieldBase
                      ,Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>);
  *(undefined4 *)((long)pvVar2 + 0x18) = 0x13e;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(message->field_0)._impl_.repeated_foreign_message_.
                       super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::ForeignMessage>);
  *(undefined4 *)((long)pvVar2 + 0x18) = 0x13f;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(message->field_0)._impl_.repeated_import_message_.super_RepeatedPtrFieldBase
                      ,Arena::DefaultConstruct<proto2_unittest_import::ImportMessage>);
  *(undefined4 *)((long)pvVar2 + 0x18) = 0x140;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(message->field_0)._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>);
  *(undefined4 *)((long)pvVar2 + 0x18) = 0x147;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 1;
  bVar1 = protobuf::internal::ValidateEnum
                    (3,(uint32_t *)proto2_unittest::TestAllTypes_NestedEnum_internal_data_);
  if (!bVar1) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestAllTypes_NestedEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.h"
                  ,0xba9d,
                  "void proto2_unittest::TestAllTypes::add_repeated_nested_enum(::proto2_unittest::TestAllTypes_NestedEnum)"
                 );
  }
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_nested_enum_,3);
  bVar1 = protobuf::internal::ValidateEnum
                    (6,(uint32_t *)proto2_unittest::ForeignEnum_internal_data_);
  if (bVar1) {
    RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_foreign_enum_,6);
    bVar1 = protobuf::internal::ValidateEnum
                      (9,(uint32_t *)&proto2_unittest_import::ImportEnum_internal_data_);
    if (bVar1) {
      RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_import_enum_,9);
      MVar4 = proto2_unittest::TestAllTypes::GetMetadata
                        ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
      MVar5 = proto2_unittest::TestAllTypes::GetMetadata
                        ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
      name._M_str = "repeated_string_piece";
      name._M_len = 0x15;
      pFVar3 = Descriptor::FindFieldByName(MVar5.descriptor,name);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"324","");
      Reflection::AddString(MVar4.reflection,&message->super_Message,pFVar3,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      MVar4 = proto2_unittest::TestAllTypes::GetMetadata
                        ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
      MVar5 = proto2_unittest::TestAllTypes::GetMetadata
                        ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
      name_00._M_str = "repeated_cord";
      name_00._M_len = 0xd;
      pFVar3 = Descriptor::FindFieldByName(MVar5.descriptor,name_00);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"325","");
      Reflection::AddString(MVar4.reflection,&message->super_Message,pFVar3,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest_import::ImportEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.h"
                  ,0xbb05,
                  "void proto2_unittest::TestAllTypes::add_repeated_import_enum(::proto2_unittest_import::ImportEnum)"
                 );
  }
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::ForeignEnum_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.h"
                ,0xbad1,
                "void proto2_unittest::TestAllTypes::add_repeated_foreign_enum(::proto2_unittest::ForeignEnum)"
               );
}

Assistant:

void AddRepeatedFields2(TestAllTypes* message) {
  // Add a second one of each field.
  message->add_repeated_int32(301);
  message->add_repeated_int64(302);
  message->add_repeated_uint32(303);
  message->add_repeated_uint64(304);
  message->add_repeated_sint32(305);
  message->add_repeated_sint64(306);
  message->add_repeated_fixed32(307);
  message->add_repeated_fixed64(308);
  message->add_repeated_sfixed32(309);
  message->add_repeated_sfixed64(310);
  message->add_repeated_float(311);
  message->add_repeated_double(312);
  message->add_repeated_bool(false);
  message->add_repeated_string("315");
  message->add_repeated_bytes("316");

  message->add_repeatedgroup()->set_a(317);
  message->add_repeated_nested_message()->set_bb(318);
  message->add_repeated_foreign_message()->set_c(319);
  message->add_repeated_import_message()->set_d(320);
  message->add_repeated_lazy_message()->set_bb(327);

  message->add_repeated_nested_enum(TestAllTypes::BAZ);
  message->add_repeated_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_BAZ);
  message->add_repeated_import_enum(ImportEnum<TestAllTypes>::IMPORT_BAZ);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->AddString(
      message,
      message->GetDescriptor()->FindFieldByName("repeated_string_piece"),
      "324");
  message->GetReflection()->AddString(
      message, message->GetDescriptor()->FindFieldByName("repeated_cord"),
      "325");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}